

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void gen_windowed_sines(int freq_count,double *freqs,double max,float *output,int output_len)

{
  float fVar1;
  double dVar2;
  double phase;
  double amplitude;
  int local_30;
  int freq;
  int k;
  int output_len_local;
  float *output_local;
  double max_local;
  double *freqs_local;
  int freq_count_local;
  
  for (local_30 = 0; local_30 < output_len; local_30 = local_30 + 1) {
    output[local_30] = 0.0;
  }
  amplitude._4_4_ = 0;
  while( true ) {
    if (freq_count <= (int)amplitude._4_4_) {
      for (local_30 = 0; local_30 < output_len; local_30 = local_30 + 1) {
        fVar1 = output[local_30];
        dVar2 = cos(((double)(local_30 << 1) * 3.141592653589793) / (double)(output_len + -1));
        output[local_30] = (float)((double)fVar1 * (dVar2 * -0.5 + 0.5));
      }
      return;
    }
    if ((freqs[(int)amplitude._4_4_] <= 0.0) || (0.5 <= freqs[(int)amplitude._4_4_])) break;
    for (local_30 = 0; local_30 < output_len; local_30 = local_30 + 1) {
      fVar1 = output[local_30];
      dVar2 = sin(freqs[(int)amplitude._4_4_] * (double)(local_30 << 1) * 3.141592653589793 +
                  2.827433388230814 / (double)freq_count);
      output[local_30] = (float)((max / (double)freq_count) * dVar2 + (double)fVar1);
    }
    amplitude._4_4_ = amplitude._4_4_ + 1;
  }
  printf("\n%s : Error : freq [%d] == %g is out of range. Should be < 0.5.\n",
         freqs[(int)amplitude._4_4_],
         "/workspace/llm4binary/github/license_c_cmakelists/libsndfile[P]libsamplerate/tests/util.c"
         ,(ulong)amplitude._4_4_);
  exit(1);
}

Assistant:

void
gen_windowed_sines (int freq_count, const double *freqs, double max, float *output, int output_len)
{	int 	k, freq ;
	double	amplitude, phase ;

	amplitude = max / freq_count ;

	for (k = 0 ; k < output_len ; k++)
		output [k] = 0.0 ;

	for (freq = 0 ; freq < freq_count ; freq++)
	{	phase = 0.9 * M_PI / freq_count ;

		if (freqs [freq] <= 0.0 || freqs [freq] >= 0.5)
		{	printf ("\n%s : Error : freq [%d] == %g is out of range. Should be < 0.5.\n", __FILE__, freq, freqs [freq]) ;
			exit (1) ;
			} ;

		for (k = 0 ; k < output_len ; k++)
			output [k] = (float) (output [k] + (amplitude * sin (freqs [freq] * (2 * k) * M_PI + phase))) ;
		} ;

	/* Apply Hanning Window. */
	for (k = 0 ; k < output_len ; k++)
		output [k] = (float) (output [k] * (0.5 - 0.5 * cos ((2 * k) * M_PI / (output_len - 1)))) ;

	/*	data [k] *= 0.3635819 - 0.4891775 * cos ((2 * k) * M_PI / (output_len - 1))
					+ 0.1365995 * cos ((4 * k) * M_PI / (output_len - 1))
					- 0.0106411 * cos ((6 * k) * M_PI / (output_len - 1)) ;
		*/

	return ;
}